

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_write(archive_write_filter *f,void *buff,size_t length)

{
  undefined1 uVar1;
  void *pvVar2;
  void *in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  int ret;
  uchar *p;
  private_uuencode *state;
  size_t in_stack_00000060;
  uchar *in_stack_00000068;
  archive_string *in_stack_00000070;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  archive_write_filter *f_00;
  void *local_20;
  int local_4;
  
  f_00 = *(archive_write_filter **)(in_RDI + 0x40);
  local_4 = 0;
  if (in_RDX == (void *)0x0) {
    local_4 = 0;
  }
  else {
    uVar3 = in_stack_ffffffffffffffc8;
    local_20 = in_RDX;
    if (f_00->data != (void *)0x0) {
      while( true ) {
        in_stack_ffffffffffffffc8 = uVar3 & 0xffffff;
        if (f_00->data < (void *)0x2d) {
          in_stack_ffffffffffffffc8 = CONCAT13(local_20 != (void *)0x0,(int3)uVar3);
        }
        if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') break;
        uVar1 = *in_RSI;
        pvVar2 = f_00->data;
        f_00->data = (void *)((long)pvVar2 + 1);
        *(undefined1 *)((long)&f_00->name + (long)pvVar2) = uVar1;
        local_20 = (void *)((long)local_20 + -1);
        uVar3 = in_stack_ffffffffffffffc8;
        in_RSI = in_RSI + 1;
      }
      if (f_00->data < (void *)0x2d) {
        return 0;
      }
      uu_encode(in_stack_00000070,in_stack_00000068,in_stack_00000060);
      f_00->data = (void *)0x0;
    }
    for (; (void *)0x2c < local_20; local_20 = (void *)((long)local_20 + -0x2d)) {
      uu_encode(in_stack_00000070,in_stack_00000068,in_stack_00000060);
      in_RSI = in_RSI + 0x2d;
    }
    if (local_20 != (void *)0x0) {
      memcpy(&f_00->name,in_RSI,(size_t)local_20);
      f_00->data = local_20;
    }
    while (f_00->free <= f_00->write) {
      local_4 = __archive_write_filter(f_00,in_RSI,CONCAT44(local_4,in_stack_ffffffffffffffc8));
      memmove(f_00->open,f_00->open + (long)f_00->free,(long)f_00->write - (long)f_00->free);
      f_00->write = f_00->write + -(long)f_00->free;
    }
  }
  return local_4;
}

Assistant:

static int
archive_filter_uuencode_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	const unsigned char *p = buff;
	int ret = ARCHIVE_OK;

	if (length == 0)
		return (ret);

	if (state->hold_len) {
		while (state->hold_len < LBYTES && length > 0) {
			state->hold[state->hold_len++] = *p++;
			length--;
		}
		if (state->hold_len < LBYTES)
			return (ret);
		uu_encode(&state->encoded_buff, state->hold, LBYTES);
		state->hold_len = 0;
	}

	for (; length >= LBYTES; length -= LBYTES, p += LBYTES)
		uu_encode(&state->encoded_buff, p, LBYTES);

	/* Save remaining bytes. */
	if (length > 0) {
		memcpy(state->hold, p, length);
		state->hold_len = length;
	}
	while (archive_strlen(&state->encoded_buff) >= state->bs) {
		ret = __archive_write_filter(f->next_filter,
		    state->encoded_buff.s, state->bs);
		memmove(state->encoded_buff.s,
		    state->encoded_buff.s + state->bs,
		    state->encoded_buff.length - state->bs);
		state->encoded_buff.length -= state->bs;
	}

	return (ret);
}